

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Loop::IsSupportedStepOp(Loop *this,Op step)

{
  return (step & ~OpSourceContinued) == OpIAdd;
}

Assistant:

bool Loop::IsSupportedStepOp(spv::Op step) const {
  switch (step) {
    case spv::Op::OpISub:
    case spv::Op::OpIAdd:
      return true;
    default:
      return false;
  }
}